

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

pointer __thiscall
gmlc::networking::TcpServer::create
          (TcpServer *this,io_context *io_context,uint16_t portNum,int nominalBufferSize)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pVar1;
  SocketFactory local_28;
  
  local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.encrypted = false;
  local_28.handshake_server = false;
  local_28._18_6_ = 0;
  create(this,&local_28,io_context,portNum,nominalBufferSize);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
              super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (pointer)pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpServer::pointer TcpServer::create(
    asio::io_context& io_context,
    uint16_t portNum,
    int nominalBufferSize)
{
    return TcpServer::create(
        SocketFactory(), io_context, portNum, nominalBufferSize);
}